

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O2

void __thiscall QDateEdit::QDateEdit(QDateEdit *this,QWidget *parent)

{
  long in_FS_OFFSET;
  undefined1 local_50 [8];
  QDate local_48;
  code *local_40 [4];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  QDate::QDate(&local_48,2000,1,1);
  ::QVariant::QVariant((QVariant *)local_40,local_48);
  QDateTimeEdit::QDateTimeEdit(&this->super_QDateTimeEdit,(QVariant *)local_40,QDate,parent);
  ::QVariant::~QVariant((QVariant *)local_40);
  *(undefined ***)&(this->super_QDateTimeEdit).super_QAbstractSpinBox.super_QWidget =
       &PTR_metaObject_007cb2a8;
  *(undefined ***)
   &(this->super_QDateTimeEdit).super_QAbstractSpinBox.super_QWidget.super_QPaintDevice =
       &PTR__QDateEdit_007cb498;
  local_40[0] = userDateChanged;
  local_40[1] = (code *)0x0;
  QObject::connect<void(QDateTimeEdit::*)(QDate),void(QDateEdit::*)(QDate)>
            ((Object *)local_50,(offset_in_QDateTimeEdit_to_subr)this,
             (ContextType *)QDateTimeEdit::dateChanged,(offset_in_QDateEdit_to_subr *)0x0,
             (ConnectionType)this);
  QMetaObject::Connection::~Connection((Connection *)local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QDateEdit::QDateEdit(QWidget *parent)
    : QDateTimeEdit(QDATETIMEEDIT_DATE_INITIAL, QMetaType::QDate, parent)
{
    connect(this, &QDateEdit::dateChanged, this, &QDateEdit::userDateChanged);
}